

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::callLoggingExit
          (CLIntercept *this,char *functionName,cl_int errorCode,cl_event *event,
          cl_sync_point_khr *syncPoint)

{
  double __x;
  string str;
  string local_70;
  string local_50;
  
  std::mutex::lock(&this->m_Mutex);
  std::__cxx11::string::string((string *)&local_70,"<<<< ",(allocator *)&local_50);
  getCallLoggingPrefix(this,&local_70);
  std::__cxx11::string::append((char *)&local_70);
  if (event != (cl_event *)0x0) {
    snprintf(this->m_StringBuffer,0x4000," created event = %p",*event);
    std::__cxx11::string::append((char *)&local_70);
  }
  if (syncPoint != (cl_sync_point_khr *)0x0) {
    snprintf(this->m_StringBuffer,0x4000," is sync point = %u",(ulong)*syncPoint);
    std::__cxx11::string::append((char *)&local_70);
  }
  std::__cxx11::string::append((char *)&local_70);
  CEnumNameMap::name_abi_cxx11_(&local_50,&this->m_EnumNameMap,errorCode);
  std::__cxx11::string::append((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  __x = (double)std::__cxx11::string::append((char *)&local_70);
  log(this,__x);
  std::__cxx11::string::~string((string *)&local_70);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::callLoggingExit(
    const char* functionName,
    const cl_int errorCode,
    const cl_event* event,
    const cl_sync_point_khr* syncPoint )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    std::string str("<<<< ");
    getCallLoggingPrefix( str );

    str += functionName;

    if( event )
    {
        CLI_SPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, " created event = %p", *event );
        str += m_StringBuffer;
    }
    if( syncPoint )
    {
        CLI_SPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, " is sync point = %u", *syncPoint );
        str += m_StringBuffer;
    }

    str += " -> ";
    str += m_EnumNameMap.name( errorCode );
    str += "\n";

    log( str );
}